

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::rawMemoryToString(void *object,uint size)

{
  _Setfill<char> _Var1;
  Arch AVar2;
  _Setw _Var3;
  ostream *poVar4;
  ostream *poVar5;
  int in_EDX;
  long in_RSI;
  String *in_RDI;
  ostream *oss;
  uchar *bytes;
  int inc;
  int end;
  int i;
  int local_20;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  local_20 = 1;
  AVar2 = anon_unknown_14::Endianness::which();
  local_1c = in_EDX;
  if (AVar2 == Little) {
    local_18 = in_EDX + -1;
    local_20 = -1;
    local_1c = -1;
  }
  poVar4 = tlssPush();
  poVar5 = std::operator<<(poVar4,"0x");
  _Var1 = std::setfill<char>('0');
  poVar5 = std::operator<<(poVar5,_Var1._M_c);
  std::ostream::operator<<(poVar5,std::hex);
  for (; local_18 != local_1c; local_18 = local_20 + local_18) {
    _Var3 = std::setw(2);
    poVar5 = std::operator<<(poVar4,_Var3);
    std::ostream::operator<<(poVar5,(uint)*(byte *)(in_RSI + local_18));
  }
  tlssPop();
  return in_RDI;
}

Assistant:

String rawMemoryToString(const void* object, unsigned size) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>(size), inc = 1;
        if(Endianness::which() == Endianness::Little) {
            i   = end - 1;
            end = inc = -1;
        }

        unsigned const char* bytes = static_cast<unsigned const char*>(object);
        std::ostream*        oss   = tlssPush();
        *oss << "0x" << std::setfill('0') << std::hex;
        for(; i != end; i += inc)
            *oss << std::setw(2) << static_cast<unsigned>(bytes[i]);
        return tlssPop();
    }